

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  undefined4 *puVar10;
  short sVar11;
  bool bVar12;
  int16_t s;
  int8_t c;
  int32_t i;
  chck_buffer buf;
  char data [33];
  char bb [33];
  
  cVar2 = chck_buffer(&buf,1,2);
  if (cVar2 == '\0') {
    pcVar9 = "chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)";
    uVar5 = 0xf;
  }
  else {
    buf.copied = false;
    free(buf.buffer);
    chck_buffer_release(&buf);
    builtin_strncpy(data + 0x10," this many bytes",0x11);
    builtin_strncpy(data,"yolo I have only",0x10);
    cVar2 = chck_buffer_from_pointer(&buf,data,0x21,2);
    if (cVar2 == '\0') {
      pcVar9 = "chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE)";
      uVar5 = 0x19;
    }
    else {
      lVar7 = chck_buffer_read(bb,1,0x21,&buf);
      if (lVar7 == 0x21) {
        chck_buffer_seek(&buf,0,0);
        lVar7 = chck_buffer_read(bb,1,0x84,&buf);
        if (lVar7 == 0x21) {
          chck_buffer_seek(&buf,0,0);
          lVar7 = chck_buffer_read(bb,8,0x21,&buf);
          if (lVar7 == 4) {
            lVar7 = chck_buffer_read(bb,0xc,0x21,&buf);
            if (lVar7 == 0) {
              lVar7 = chck_buffer_read(bb,1,0x21,&buf);
              if (lVar7 == 1) {
                chck_buffer_release(&buf);
                cVar2 = chck_buffer(&buf,1,2);
                if (cVar2 == '\0') {
                  pcVar9 = "chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)";
                  uVar5 = 0x28;
                }
                else {
                  lVar7 = chck_buffer_write_format
                                    (&buf,"Hello %s, I\'m in your buffer at %d:%.2d clock!","buffer"
                                     ,10,0);
                  if (lVar7 == 0x30) {
                    chck_buffer_seek(&buf,0,0);
                    iVar4 = bcmp(buf.buffer,"Hello buffer, I\'m in your buffer at 10:00 clock!",0x30
                                );
                    if (iVar4 == 0) {
                      chck_buffer_release(&buf);
                      for (lVar7 = 0x10; lVar7 != 0x40; lVar7 = lVar7 + 0x18) {
                        uVar5 = *(uint *)((long)&PTR_anon_var_dwarf_148_00105da0 + lVar7);
                        cVar2 = chck_buffer_from_pointer
                                          (&buf,*(undefined8 *)
                                                 ((long)&__frame_dummy_init_array_entry + lVar7),
                                           0x2e,uVar5);
                        if (cVar2 == '\0') {
                          pcVar9 = 
                          "chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess)"
                          ;
                          uVar5 = 0x49;
                          goto LAB_00102106;
                        }
                        if (uVar5 != buf.endianess) {
                          pcVar9 = "buf.endianess == tests[t].endianess";
                          uVar5 = 0x4a;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_string(data,bb,&buf);
                        uVar1 = data._0_8_;
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_string(&str, &len, &buf)";
                          uVar5 = 0x4c;
                          goto LAB_00102106;
                        }
                        if (bb._0_8_ != 0x12) {
                          pcVar9 = "len == strlen(\"this integer is 5:\")";
                          uVar5 = 0x4d;
                          goto LAB_00102106;
                        }
                        iVar4 = strcmp((char *)data._0_8_,"this integer is 5:");
                        if (iVar4 != 0) {
                          pcVar9 = "!strcmp(str, \"this integer is 5:\")";
                          uVar5 = 0x4e;
                          goto LAB_00102106;
                        }
                        free((void *)uVar1);
                        cVar2 = chck_buffer_read_string_of_type(data,0,1,&buf);
                        uVar1 = data._0_8_;
                        if (cVar2 == '\0') {
                          pcVar9 = 
                          "chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)";
                          uVar5 = 0x4f;
                          goto LAB_00102106;
                        }
                        iVar4 = strcmp((char *)data._0_8_,"this integer is 5:");
                        if (iVar4 != 0) {
                          pcVar9 = "strcmp(str, \"this integer is 5:\") == 0";
                          uVar5 = 0x50;
                          goto LAB_00102106;
                        }
                        free((void *)uVar1);
                        cVar2 = chck_buffer_read_int(&i,4,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&i, sizeof(i), &buf)";
                          uVar5 = 0x51;
                          goto LAB_00102106;
                        }
                        if (i != 5) {
                          pcVar9 = "i == 5";
                          uVar5 = 0x52;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_int(&s,2,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&s, sizeof(s), &buf)";
                          uVar5 = 0x53;
                          goto LAB_00102106;
                        }
                        if (s != 1) {
                          pcVar9 = "s == 1";
                          uVar5 = 0x54;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_int(&c,1,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&c, sizeof(c), &buf)";
                          uVar5 = 0x55;
                          goto LAB_00102106;
                        }
                        if (c != '\x01') {
                          pcVar9 = "c == 1";
                          uVar5 = 0x56;
                          goto LAB_00102106;
                        }
                        if (buf.buffer + buf.size != buf.curpos) {
                          pcVar9 = "(buf.curpos - buf.buffer) - buf.size == 0";
                          uVar5 = 0x57;
                          goto LAB_00102106;
                        }
                        chck_buffer_release(&buf);
                      }
                      data[0] = ' ';
                      data[1] = '\0';
                      data[2] = '\0';
                      data[3] = '\0';
                      data[4] = '\0';
                      data[5] = '\0';
                      data[6] = '\0';
                      data[7] = '\0';
                      i = 8;
                      s = 6;
                      puVar10 = &DAT_00103b20;
                      lVar7 = 0;
                      do {
                        if (lVar7 == 2) {
                          builtin_strncpy(data,".....................",0x16);
                          chck_buffer_from_pointer(&buf,data,0x16,2);
                          cVar2 = chck_buffer_has_zlib();
                          if (cVar2 == '\0') {
                            __assert_fail("chck_buffer_has_zlib()",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x8d,"int main(void)");
                          }
                          cVar2 = chck_buffer_compress_zlib(&buf);
                          if (cVar2 == '\0') {
                            __assert_fail("chck_buffer_compress_zlib(&buf)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x8e,"int main(void)");
                          }
                          if (buf.size != 0xc) {
                            __assert_fail("buf.size == sizeof(compressed)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x8f,"int main(void)");
                          }
                          iVar4 = bcmp(buf.buffer,&DAT_00103b14,0xc);
                          if (iVar4 != 0) {
                            __assert_fail("memcmp(buf.buffer, compressed, sizeof(compressed)) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x90,"int main(void)");
                          }
                          cVar2 = chck_buffer_decompress_zlib(&buf);
                          if (cVar2 == '\0') {
                            __assert_fail("chck_buffer_decompress_zlib(&buf)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x92,"int main(void)");
                          }
                          if (buf.size != 0x16) {
                            __assert_fail("buf.size == sizeof(uncompressed)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x93,"int main(void)");
                          }
                          iVar4 = bcmp(buf.buffer,data,0x16);
                          if (iVar4 != 0) {
                            __assert_fail("memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                          ,0x94,"int main(void)");
                          }
                          chck_buffer_release(&buf);
                          lVar7 = 0;
                          do {
                            if (lVar7 == 2) {
                              return 0;
                            }
                            cVar2 = chck_buffer(&buf,0x3ffffc0,(&DAT_00103b20)[lVar7]);
                            if (cVar2 == '\0') {
                              __assert_fail("chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i])"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                            ,0xa3,"int main(void)");
                            }
                            for (data._0_8_ = 0; (ulong)data._0_8_ < 0xfffff;
                                data._0_8_ = data._0_8_ + 1) {
                              cVar2 = chck_buffer_write_int(data,8,&buf);
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xa4,"int main(void)");
                              }
                            }
                            uVar5 = 0;
                            while (data[0] = (char)uVar5, data[1] = (char)(uVar5 >> 8),
                                  data[2] = (char)(uVar5 >> 0x10), data[3] = (char)(uVar5 >> 0x18),
                                  uVar5 < 0xfffff) {
                              cVar2 = chck_buffer_write_int(data,4,&buf);
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xa5,"int main(void)");
                              }
                              uVar5 = data._0_4_ + 1;
                            }
                            sVar11 = 0;
                            while (data[0] = (char)sVar11, data[1] = (char)((ushort)sVar11 >> 8),
                                  sVar11 != -1) {
                              cVar2 = chck_buffer_write_int(data,2,&buf);
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xa6,"int main(void)");
                              }
                              sVar11 = data._0_2_ + 1;
                            }
                            cVar2 = '\0';
                            while (data[0] = cVar2, cVar2 != -1) {
                              cVar2 = chck_buffer_write_int(data,1,&buf);
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xa7,"int main(void)");
                              }
                              cVar2 = data[0] + '\x01';
                            }
                            iVar4 = 0x100000;
                            while (iVar4 = iVar4 + -1, iVar4 != 0) {
                              cVar2 = chck_buffer_write_string("yolo",4,&buf);
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_write_string(\"yolo\", 4, &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xa8,"int main(void)");
                              }
                            }
                            chck_buffer_seek(&buf,0,0);
                            lVar8 = -1;
                            while (lVar8 != 0xffffe) {
                              cVar2 = chck_buffer_read_int(data,8,&buf);
                              if (cVar2 == '\0') {
                                pcVar9 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
                                goto LAB_00101bda;
                              }
                              lVar8 = lVar8 + 1;
                              if (lVar8 != data._0_8_) {
                                pcVar9 = "a == t";
LAB_00101bda:
                                __assert_fail(pcVar9,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xaa,"int main(void)");
                              }
                            }
                            iVar4 = -1;
                            while (iVar4 != 0xffffe) {
                              cVar2 = chck_buffer_read_int(data,4,&buf);
                              if (cVar2 == '\0') {
                                pcVar9 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
                                goto LAB_00101c02;
                              }
                              iVar4 = iVar4 + 1;
                              if (iVar4 != data._0_4_) {
                                pcVar9 = "a == t";
LAB_00101c02:
                                __assert_fail(pcVar9,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xab,"int main(void)");
                              }
                            }
                            sVar11 = -1;
                            while (sVar11 != -2) {
                              cVar2 = chck_buffer_read_int(data,2,&buf);
                              if (cVar2 == '\0') {
                                pcVar9 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
                                goto LAB_00101c2a;
                              }
                              sVar11 = sVar11 + 1;
                              if (sVar11 != data._0_2_) {
                                pcVar9 = "a == t";
LAB_00101c2a:
                                __assert_fail(pcVar9,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xac,"int main(void)");
                              }
                            }
                            cVar2 = -1;
                            while (cVar2 != -2) {
                              cVar3 = chck_buffer_read_int(data,1,&buf);
                              if (cVar3 == '\0') {
                                pcVar9 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
                                goto LAB_00101c52;
                              }
                              cVar2 = cVar2 + '\x01';
                              if (cVar2 != data[0]) {
                                pcVar9 = "a == t";
LAB_00101c52:
                                __assert_fail(pcVar9,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xad,"int main(void)");
                              }
                            }
                            iVar4 = 0xfffff;
                            while (bVar12 = iVar4 != 0, iVar4 = iVar4 + -1, bVar12) {
                              cVar2 = chck_buffer_read_string(data,bb,&buf);
                              uVar1 = data._0_8_;
                              if (cVar2 == '\0') {
                                __assert_fail("chck_buffer_read_string(&t, &len, &buf)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xb1,"int main(void)");
                              }
                              iVar6 = strcmp((char *)data._0_8_,"yolo");
                              if (iVar6 != 0) {
                                __assert_fail("!strcmp(t, \"yolo\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xb2,"int main(void)");
                              }
                              if (bb._0_8_ != 4) {
                                __assert_fail("len == 4",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                              ,0xb3,"int main(void)");
                              }
                              free((void *)uVar1);
                            }
                            chck_buffer_release(&buf);
                            lVar7 = lVar7 + 1;
                          } while( true );
                        }
                        cVar2 = chck_buffer(&buf,0xb,*puVar10);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer(&buf, 5+6, tests[t])";
                          uVar5 = 0x65;
                          goto LAB_00102106;
                        }
                        if ((uint)lVar7 != (uint)buf.endianess) {
                          pcVar9 = 
                          "(tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf)"
                          ;
                          uVar5 = 0x66;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_write_string("test",4,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_write_string(\"test\", 4, &buf) == 1";
                          uVar5 = 0x68;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_write_string_of_type("test",4,1,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = 
                          "chck_buffer_write_string_of_type(\"test\", 4, sizeof(uint8_t), &buf)";
                          uVar5 = 0x69;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_resize(&buf,0x19);
                        if (cVar2 == '\0') {
                          pcVar9 = 
                          "chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t))"
                          ;
                          uVar5 = 0x6a;
                          goto LAB_00102106;
                        }
                        if (buf.size != 0x19) {
                          pcVar9 = 
                          "buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)";
                          uVar5 = 0x6b;
                          goto LAB_00102106;
                        }
                        if ((long)buf.curpos - (long)buf.buffer != 0xb) {
                          pcVar9 = "buf.curpos - buf.buffer == 6+5";
                          uVar5 = 0x6c;
                          goto LAB_00102106;
                        }
                        if (buf.buffer == buf.curpos) {
                          pcVar9 = "buf.buffer != buf.curpos";
                          uVar5 = 0x6d;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_write_int(data,8,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_write_int(&l, sizeof(l), &buf)";
                          uVar5 = 0x6f;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_write_int(&i,4,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_write_int(&i, sizeof(i), &buf)";
                          uVar5 = 0x70;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_write_int(&s,2,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_write_int(&s, sizeof(s), &buf)";
                          uVar5 = 0x71;
                          goto LAB_00102106;
                        }
                        if (buf.buffer + buf.size != buf.curpos) {
                          pcVar9 = "(buf.curpos - buf.buffer) - buf.size == 0";
                          uVar5 = 0x72;
                          goto LAB_00102106;
                        }
                        lVar8 = chck_buffer_seek(&buf,0,0);
                        if (lVar8 != (long)buf.curpos - (long)buf.buffer) {
                          pcVar9 = "chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer";
                          uVar5 = 0x74;
                          goto LAB_00102106;
                        }
                        if (buf.curpos != buf.buffer) {
                          pcVar9 = "buf.curpos - buf.buffer == 0";
                          uVar5 = 0x75;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_string(bb,0,&buf);
                        uVar1 = bb._0_8_;
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_string(&str, NULL, &buf)";
                          uVar5 = 0x77;
                          goto LAB_00102106;
                        }
                        iVar4 = strcmp((char *)bb._0_8_,"test");
                        if (iVar4 != 0) {
                          pcVar9 = "strcmp(str, \"test\") == 0";
                          uVar5 = 0x78;
                          goto LAB_00102106;
                        }
                        free((void *)uVar1);
                        cVar2 = chck_buffer_read_string_of_type(bb,0,1,&buf);
                        uVar1 = bb._0_8_;
                        if (cVar2 == '\0') {
                          pcVar9 = 
                          "chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)";
                          uVar5 = 0x79;
                          goto LAB_00102106;
                        }
                        iVar4 = strcmp((char *)bb._0_8_,"test");
                        if (iVar4 != 0) {
                          pcVar9 = "strcmp(str, \"test\") == 0";
                          uVar5 = 0x7a;
                          goto LAB_00102106;
                        }
                        free((void *)uVar1);
                        cVar2 = chck_buffer_read_int(data,8,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&l, sizeof(l), &buf)";
                          uVar5 = 0x7b;
                          goto LAB_00102106;
                        }
                        if (data._0_8_ != 0x20) {
                          pcVar9 = "l == 32";
                          uVar5 = 0x7c;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_int(&i,4,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&i, sizeof(i), &buf)";
                          uVar5 = 0x7d;
                          goto LAB_00102106;
                        }
                        if (i != 8) {
                          pcVar9 = "i == 8";
                          uVar5 = 0x7e;
                          goto LAB_00102106;
                        }
                        cVar2 = chck_buffer_read_int(&s,2,&buf);
                        if (cVar2 == '\0') {
                          pcVar9 = "chck_buffer_read_int(&s, sizeof(s), &buf)";
                          uVar5 = 0x7f;
                          goto LAB_00102106;
                        }
                        if (s != 6) {
                          __assert_fail("s == 6",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                        ,0x80,"int main(void)");
                        }
                        if (buf.buffer + buf.size != buf.curpos) {
                          __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                        ,0x81,"int main(void)");
                        }
                        chck_buffer_release(&buf);
                        lVar7 = lVar7 + 1;
                        puVar10 = puVar10 + 1;
                      } while( true );
                    }
                    pcVar9 = "!memcmp(buf.buffer, result, strlen(result))";
                    uVar5 = 0x2c;
                  }
                  else {
                    pcVar9 = 
                    "chck_buffer_write_format(&buf, \"Hello %s, I\'m in your buffer at %d:%.2d clock!\", \"buffer\", 10, 0) == strlen(result)"
                    ;
                    uVar5 = 0x2a;
                  }
                }
              }
              else {
                pcVar9 = "chck_buffer_read(bb, 1, sizeof(data), &buf) == 1";
                uVar5 = 0x21;
              }
            }
            else {
              pcVar9 = "chck_buffer_read(bb, 12, sizeof(data), &buf) == 0";
              uVar5 = 0x20;
            }
          }
          else {
            pcVar9 = "chck_buffer_read(bb, 8, sizeof(data), &buf) == 4";
            uVar5 = 0x1f;
          }
        }
        else {
          pcVar9 = "chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data)";
          uVar5 = 0x1d;
        }
      }
      else {
        pcVar9 = "chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data)";
        uVar5 = 0x1b;
      }
    }
  }
LAB_00102106:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                ,uVar5,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: ownership move */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      buf.copied = false;
      free(buf.buffer);
      chck_buffer_release(&buf); // should not SIGSEGV
   }

   /* TEST: over-read */
   {
      struct chck_buffer buf;
      char data[] = "yolo I have only this many bytes";
      assert(chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE));
      char bb[sizeof(data)];
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 8, sizeof(data), &buf) == 4);
      assert(chck_buffer_read(bb, 12, sizeof(data), &buf) == 0);
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == 1);
      chck_buffer_release(&buf);
   }

   /* TEST: writing format */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      const char *result = "Hello buffer, I'm in your buffer at 10:00 clock!";
      assert(chck_buffer_write_format(&buf, "Hello %s, I'm in your buffer at %d:%.2d clock!", "buffer", 10, 0) == strlen(result));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(!memcmp(buf.buffer, result, strlen(result)));
      chck_buffer_release(&buf);

   }

   /* TEST: little endian buffer */
   {
      const struct {
         char *data;
         size_t size;
         enum chck_endianess endianess;
      } tests[] = {
         {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1") - 1,
            .endianess = CHCK_ENDIANESS_LITTLE,
         }, {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1") - 1,
            .endianess = CHCK_ENDIANESS_BIG,
         },
      };

      for (int t = 0; t < 2; ++t) {
         int32_t i;
         int16_t s;
         int8_t c;
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess));
         assert(buf.endianess == tests[t].endianess);
         size_t len;
         assert(chck_buffer_read_string(&str, &len, &buf));
         assert(len == strlen("this integer is 5:"));
         assert(!strcmp(str, "this integer is 5:")); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "this integer is 5:") == 0); free(str);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 5);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 1);
         assert(chck_buffer_read_int(&c, sizeof(c), &buf));
         assert(c == 1);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: buffer write && read && resize */
   {
      int64_t l = 32;
      int32_t i = 8;
      int16_t s = 6;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int t = 0; t < 2; ++t) {
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer(&buf, 5+6, tests[t]));
         assert((tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf));

         assert(chck_buffer_write_string("test", 4, &buf) == 1);
         assert(chck_buffer_write_string_of_type("test", 4, sizeof(uint8_t), &buf));
         assert(chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)));
         assert(buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t));
         assert(buf.curpos - buf.buffer == 6+5);
         assert(buf.buffer != buf.curpos);

         assert(chck_buffer_write_int(&l, sizeof(l), &buf));
         assert(chck_buffer_write_int(&i, sizeof(i), &buf));
         assert(chck_buffer_write_int(&s, sizeof(s), &buf));
         assert((buf.curpos - buf.buffer) - buf.size == 0);

         assert(chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer);
         assert(buf.curpos - buf.buffer == 0);

         assert(chck_buffer_read_string(&str, NULL, &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_int(&l, sizeof(l), &buf));
         assert(l == 32);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 8);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 6);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: zlib compression && decompression */
   {
      char uncompressed[] = ".....................";
      struct chck_buffer buf;
      chck_buffer_from_pointer(&buf, uncompressed, sizeof(uncompressed), CHCK_ENDIANESS_NATIVE);
#if HAS_ZLIB
      uint8_t compressed[] = { 0x78, 0x9c, 0xd3, 0xd3, 0xc3, 0x2, 0x18, 0x0, 0x2d, 0x5e, 0x3, 0xc7 };
      assert(chck_buffer_has_zlib());
      assert(chck_buffer_compress_zlib(&buf));
      assert(buf.size == sizeof(compressed));
      assert(memcmp(buf.buffer, compressed, sizeof(compressed)) == 0);

      assert(chck_buffer_decompress_zlib(&buf));
      assert(buf.size == sizeof(uncompressed));
      assert(memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0);
#else
      assert(!chck_buffer_has_zlib());
      assert(!chck_buffer_compress_zlib(&buf));
      assert(!chck_buffer_decompress_zlib(&buf));
#endif
      chck_buffer_release(&buf);
   }

   /* TEST: benchmark read/write (small writes, native && non-native) */
   {
      const uint32_t iters = 0xFFFFF;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int i = 0; i < 2; ++i) {
         struct chck_buffer buf;
         assert(chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i]));
         for (uint64_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint16_t a = 0; a < 0xFFFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint8_t a = 0; a < 0xFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_string("yolo", 4, &buf));
         chck_buffer_seek(&buf, 0, SEEK_SET);
         for (uint64_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint16_t t, a = 0; a < 0xFFFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint8_t t, a = 0; a < 0xFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t a = 0; a < iters; ++a) {
            char *t;
            size_t len;
            assert(chck_buffer_read_string(&t, &len, &buf));
            assert(!strcmp(t, "yolo"));
            assert(len == 4);
            free(t);
         }
         chck_buffer_release(&buf);
      }
   }

   return EXIT_SUCCESS;
}